

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::Array2D<float>::Array2D(Array2D<float> *this,int nx,int ny,allocator_type allocator)

{
  Bounds2i *in_RCX;
  undefined8 in_RDI;
  Point2<int> *in_stack_ffffffffffffffc0;
  Array2D<float> *in_stack_ffffffffffffffc8;
  allocator_type in_stack_ffffffffffffffd0;
  
  Point2<int>::Point2(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  Point2<int>::Point2(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  Bounds2<int>::Bounds2
            ((Bounds2<int> *)in_stack_ffffffffffffffd0.memoryResource,
             (Point2<int> *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Array2D(in_stack_ffffffffffffffc8,in_RCX,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Array2D(int nx, int ny, allocator_type allocator = {})
        : Array2D({{0, 0}, {nx, ny}}, allocator) {}